

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_array_defs.h
# Opt level: O2

ON_Internal_ExtrudedVertex * __thiscall
ON_SimpleArray<ON_Internal_ExtrudedVertex>::AppendNew
          (ON_SimpleArray<ON_Internal_ExtrudedVertex> *this)

{
  ON_Internal_ExtrudedVertex *pOVar1;
  ON_Internal_ExtrudedVertex *pOVar2;
  int iVar3;
  
  iVar3 = this->m_count;
  if (iVar3 == this->m_capacity) {
    iVar3 = NewCapacity(this);
    Reserve(this,(long)iVar3);
    iVar3 = this->m_count;
  }
  pOVar1 = this->m_a;
  pOVar1[iVar3].m_original_vertex = (ON_SubDVertex *)0x0;
  (&pOVar1[iVar3].m_original_vertex)[1] = (ON_SubDVertex *)0x0;
  pOVar2 = pOVar1 + iVar3;
  pOVar2->m_extruded_edges_count = '\0';
  pOVar2->m_initial_vertex_tag = Unset;
  pOVar2->m_connecting_edge_tag = Unset;
  pOVar2->field_0x13 = 0;
  pOVar2->m_initial_vertex_id = 0;
  *(undefined8 *)(&pOVar2->m_extruded_edges_count + 8) = 0;
  pOVar1[iVar3].m_connecting_edge = (ON_SubDEdge *)0x0;
  pOVar1[iVar3].m_extruded_edges[0] = (ON_Internal_ExtrudedEdge *)0x0;
  pOVar1[iVar3].m_extruded_edges[1] = (ON_Internal_ExtrudedEdge *)0x0;
  iVar3 = this->m_count;
  this->m_count = iVar3 + 1;
  return this->m_a + iVar3;
}

Assistant:

T& ON_SimpleArray<T>::AppendNew()
{
  if ( m_count == m_capacity ) 
  {
    int new_capacity = NewCapacity();
    Reserve( new_capacity );
  }
  memset( (void*)(&m_a[m_count]), 0, sizeof(T) );
  return m_a[m_count++];
}